

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

uint32_t __thiscall
ddd::DaTrie<false,_false,_false>::xcheck_
          (DaTrie<false,_false,_false> *this,Edge *edge,
          vector<ddd::Block,_std::allocator<ddd::Block>_> *blocks)

{
  pointer pBVar1;
  bool bVar2;
  ulong uVar3;
  uint32_t uVar4;
  uint base;
  uint uVar5;
  
  if (edge->size_ == 1) {
    uVar5 = (uint)((ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3);
    if (this->head_pos_ != 0xffffffff) {
      uVar5 = this->head_pos_;
    }
    uVar4 = uVar5 ^ edge->labels_[0];
  }
  else {
    uVar4 = this->head_pos_;
    uVar5 = uVar4;
    if (uVar4 == 0xffffffff) {
      uVar3 = (long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                    super__Vector_impl_data._M_start;
    }
    else {
      do {
        if (edge->size_ <=
            (ulong)(blocks->super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar5 >> 8].num_emps) {
          base = edge->labels_[0] ^ uVar5;
          bVar2 = is_target_(this,base,edge);
          if (bVar2) {
            return base;
          }
          uVar4 = this->head_pos_;
        }
        pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = *(uint *)(pBVar1 + uVar5) & 0x7fffffff;
      } while (uVar5 != uVar4);
      uVar3 = (long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pBVar1;
    }
    uVar4 = (uint)edge->labels_[0] ^ (uint)(uVar3 >> 3);
  }
  return uVar4;
}

Assistant:

uint32_t xcheck_(const Edge& edge, const std::vector<Block>& blocks) const {
    if (edge.size() == 1) {
      return xcheck_(*edge.begin(), blocks);
    }

    if (head_pos_ == NOT_FOUND) {
      return bc_size() ^ *edge.begin();
    }

    auto node_pos = head_pos_;
    do {
      if (blocks[node_pos / BLOCK_SIZE].num_emps < edge.size()) {
        continue;
      }

      auto base = node_pos ^*edge.begin();
      if (is_target_(base, edge)) {
        return base;
      }
    } while ((node_pos = next_(node_pos)) != head_pos_);

    return bc_size() ^ *edge.begin();
  }